

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>_>
  *this_00;
  string *psVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  LocationRecorder location;
  string identifier;
  
  this_00 = internal::RepeatedPtrFieldBase::
            Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>>
                      (&(uninterpreted_option->field_0)._impl_.name_.super_RepeatedPtrFieldBase);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  identifier._M_string_length = 0;
  identifier.field_2._M_local_buf[0] = '\0';
  text._M_str = "(";
  text._M_len = 1;
  bVar1 = LookingAt(this,text);
  if (bVar1) {
    text_00._M_str = "(";
    text_00._M_len = 1;
    bVar1 = Consume(this,text_00);
    if (bVar1) {
      LocationRecorder::LocationRecorder(&location,part_location,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar1 = ConsumeIdentifier(this,&identifier,(ErrorMaker)ZEXT816(0x372533));
        if (!bVar1) goto LAB_001c016c;
        psVar2 = UninterpretedOption_NamePart::_internal_mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)psVar2);
      }
      while( true ) {
        text_01._M_str = ".";
        text_01._M_len = 1;
        bVar1 = LookingAt(this,text_01);
        if (!bVar1) break;
        text_02._M_str = ".";
        text_02._M_len = 1;
        bVar1 = Consume(this,text_02);
        if (!bVar1) goto LAB_001c016c;
        psVar2 = UninterpretedOption_NamePart::_internal_mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((char *)psVar2);
        bVar1 = ConsumeIdentifier(this,&identifier,(ErrorMaker)ZEXT816(0x372533));
        if (!bVar1) goto LAB_001c016c;
        psVar2 = UninterpretedOption_NamePart::_internal_mutable_name_part_abi_cxx11_(this_00);
        std::__cxx11::string::append((string *)psVar2);
      }
      LocationRecorder::~LocationRecorder(&location);
      text_03._M_str = ")";
      text_03._M_len = 1;
      bVar1 = Consume(this,text_03);
      if (bVar1) {
        (this_00->field_0)._impl_.is_extension_ = true;
        *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 2;
        goto LAB_001c0168;
      }
    }
  }
  else {
    LocationRecorder::LocationRecorder(&location,part_location,1);
    bVar1 = ConsumeIdentifier(this,&identifier,(ErrorMaker)ZEXT816(0x372533));
    if (bVar1) {
      psVar2 = UninterpretedOption_NamePart::_internal_mutable_name_part_abi_cxx11_(this_00);
      std::__cxx11::string::append((string *)psVar2);
      (this_00->field_0)._impl_.is_extension_ = false;
      *(byte *)&this_00->field_0 = *(byte *)&this_00->field_0 | 2;
      LocationRecorder::~LocationRecorder(&location);
LAB_001c0168:
      bVar1 = true;
      goto LAB_001c0176;
    }
LAB_001c016c:
    LocationRecorder::~LocationRecorder(&location);
  }
  bVar1 = false;
LAB_001c0176:
  std::__cxx11::string::~string((string *)&identifier);
  return bVar1;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  std::string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {    // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}